

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepSetOrder(void *arkode_mem,int ord)

{
  int in_ESI;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  long local_20;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeMRIStepMem *)0xee5218);
  if (local_4 == 0) {
    if ((in_ESI < 3) || (4 < in_ESI)) {
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x40) = 3;
    }
    else {
      *(int *)((long)in_stack_ffffffffffffffd8 + 0x40) = in_ESI;
    }
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x48) = 0;
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x44) = 0;
    MRIStepCoupling_Space
              (*(MRIStepCoupling *)((long)in_stack_ffffffffffffffd8 + 0x38),
               (sunindextype *)&stack0xffffffffffffffd0,(sunindextype *)&stack0xffffffffffffffd4);
    MRIStepCoupling_Free
              ((MRIStepCoupling)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x38) = 0;
    *(long *)(local_20 + 0x220) = *(long *)(local_20 + 0x220) - (long)in_stack_ffffffffffffffd0;
    *(long *)(local_20 + 0x218) = *(long *)(local_20 + 0x218) - (long)in_stack_ffffffffffffffd4;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepSetOrder(void *arkode_mem, int ord)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval) return(retval);

  /* check for illegal inputs */
  if (ord < 3 || ord > 4) {
    step_mem->q = 3;
  } else {
    step_mem->q = ord;
  }

  /* Clear tables, the user is requesting a change in method or a reset to
     defaults. Tables will be set in InitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  return(ARK_SUCCESS);
}